

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsStats::DnsStats(DnsStats *this)

{
  (this->hashTable).tableSize = 0;
  (this->hashTable).tableCount = 0;
  (this->hashTable).hashBin = (DnsHashEntry **)0x0;
  AddressFilter::AddressFilter(&this->rootAddresses);
  AddressFilter::AddressFilter(&this->allowedAddresses);
  AddressFilter::AddressFilter(&this->bannedAddresses);
  AddressUseTracker::AddressUseTracker(&this->frequentAddresses);
  (this->tldLeakage).targetSize = 0;
  (this->tldLeakage).MostRecentlyUsed = (TldAsKey *)0x0;
  (this->tldLeakage).LeastRecentlyUsed = (TldAsKey *)0x0;
  (this->tldLeakage).binHash.tableSize = 0;
  (this->tldLeakage).binHash.tableCount = 0;
  (this->tldLeakage).binHash.hashBin = (TldAsKey **)0x0;
  (this->secondLdLeakage).MostRecentlyUsed = (TldAsKey *)0x0;
  (this->secondLdLeakage).LeastRecentlyUsed = (TldAsKey *)0x0;
  (this->secondLdLeakage).targetSize = 0;
  (this->secondLdLeakage).binHash.tableSize = 0;
  (this->secondLdLeakage).binHash.tableCount = 0;
  (this->secondLdLeakage).binHash.hashBin = (TldAsKey **)0x0;
  (this->queryUsage).tableSize = 0;
  (this->queryUsage).tableCount = 0;
  (this->queryUsage).hashBin = (TldAddressAsKey **)0x0;
  (this->registeredTld).tableSize = 0;
  (this->registeredTld).tableCount = 0;
  (this->registeredTld).hashBin = (TldAsKey **)0x0;
  (this->tldStringUsage).MostRecentlyUsed = (TldAsKey *)0x0;
  (this->tldStringUsage).LeastRecentlyUsed = (TldAsKey *)0x0;
  (this->tldStringUsage).targetSize = 0;
  (this->tldStringUsage).binHash.tableSize = 0;
  (this->tldStringUsage).binHash.tableCount = 0;
  (this->tldStringUsage).binHash.hashBin = (TldAsKey **)0x0;
  (this->dnsPrefixTable).tableSize = 0;
  (this->dnsPrefixTable).tableCount = 0;
  (this->dnsPrefixTable).hashBin = (DnsPrefixEntry **)0x0;
  (this->dnssecPrefixTable).tableSize = 0;
  (this->dnssecPrefixTable).tableCount = 0;
  (this->dnssecPrefixTable).hashBin = (DnssecPrefixEntry **)0x0;
  (this->statsByIp).tableSize = 0;
  (this->statsByIp).tableCount = 0;
  (this->statsByIp).hashBin = (StatsByIP **)0x0;
  (this->nameList).tableSize = 0;
  (this->nameList).tableCount = 0;
  (this->nameList).hashBin = (DnsNameEntry **)0x0;
  this->is_capture_dns_only = true;
  this->is_capture_stopped = false;
  this->t_start_sec = 0;
  this->t_start_usec = 0;
  this->target_number_dns_packets = 0;
  this->duration_usec = 0;
  this->volume_53only = 0;
  this->enable_frequent_address_filtering = false;
  this->capture_cache_ratio_nx_domain = false;
  this->frequent_address_max_count = 0x80;
  this->max_tld_leakage_count = 0x80;
  this->max_tld_leakage_table_count = 0x8000;
  this->max_query_usage_count = 8000000;
  this->max_tld_string_usage_count = 0x8000;
  this->max_tld_string_leakage_count = 0x200;
  this->max_stats_by_ip_count = 0x8000;
  this->error_flags = 0;
  this->dnssec_name_index = 0;
  this->dnsstat_flags = 0;
  this->record_count = 0;
  this->query_count = 0;
  this->response_count = 0;
  *(undefined8 *)((long)&this->dnssec_packet + 6) = 0;
  this->dnssec_packet = (uint8_t *)0x0;
  *(undefined8 *)((long)&this->edns_options + 6) = 0;
  this->edns_options = (uint8_t *)0x0;
  this->address_report = (char *)0x0;
  this->name_report = (char *)0x0;
  this->compress_name_and_address_reports = false;
  return;
}

Assistant:

DnsStats::DnsStats()
    :
    is_capture_dns_only(true),
    is_capture_stopped(false),
    t_start_sec(0),
    t_start_usec(0),
    duration_usec(0),
    volume_53only(0),
    enable_frequent_address_filtering(false),
    capture_cache_ratio_nx_domain(false),
    target_number_dns_packets(0),
    frequent_address_max_count(128),
    max_tld_leakage_count(0x80),
    max_tld_leakage_table_count(0x8000),
    max_query_usage_count(8000000),
    max_tld_string_usage_count(0x8000),
    max_tld_string_leakage_count(0x200),
    max_stats_by_ip_count(0x8000),
    dnsstat_flags(0),
    record_count(0),
    query_count(0),
    response_count(0),
    error_flags(0),
    dnssec_name_index(0),
    dnssec_packet(NULL),
    dnssec_packet_length(0),
    is_do_flag_set(false),
    is_using_edns(false),
    edns_options(NULL),
    edns_options_length(0),
    is_qname_minimized(false),
    is_recursive_query(false),
    address_report(NULL),
    name_report(NULL),
    compress_name_and_address_reports(false)
{
}